

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_warningCircularImportReferencesComponent_Test::
~Importer_warningCircularImportReferencesComponent_Test
          (Importer_warningCircularImportReferencesComponent_Test *this)

{
  Importer_warningCircularImportReferencesComponent_Test *this_local;
  
  ~Importer_warningCircularImportReferencesComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, warningCircularImportReferencesComponent)
{
    const std::string errorMessage =
        std::string("Cyclic dependencies were found when attempting to resolve a component in the model 'circularImport1'. The dependency loop is:\n")
        + " - component 'i_am_cyclic' specifies an import from ':this:' to '" + resourcePath("importer/") + "circularImport_2.cellml';\n"
        + " - component 'c2' specifies an import from '" + resourcePath("importer/") + "circularImport_2.cellml' to '" + resourcePath("importer/") + "circularImport_3.cellml'; and\n"
        + " - component 'c3' specifies an import from '" + resourcePath("importer/") + "circularImport_3.cellml' to '" + resourcePath("importer/") + "circularImport_1.cellml'.";

    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/circularImport_1.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));

    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(errorMessage, importer->error(0)->description());
}